

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void QHashPrivate::Node<QString,QVariant>::createInPlace<QVariant_const&>
               (Node<QString,_QVariant> *n,QString *k,QVariant *args)

{
  QArrayDataPointer<char16_t>::QArrayDataPointer((QArrayDataPointer<char16_t> *)n,&k->d);
  ::QVariant::QVariant(&n->value,args);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }